

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O1

value_type __thiscall
FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>_>
::fastAccessDx(FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>_>
               *this,int i)

{
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_> *pFVar1
  ;
  Fad<double> *pFVar2;
  FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_> *pFVar3;
  Fad<double> *pFVar4;
  Fad<double> *pFVar5;
  FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>
  *pFVar6;
  FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_> *pFVar7;
  FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_> *pFVar8;
  FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_> *pFVar9;
  value_type vVar10;
  
  vVar10 = FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>
           ::fastAccessDx(&this->left_->fadexpr_,i);
  pFVar1 = (this->right_->fadexpr_).left_;
  pFVar2 = (this->right_->fadexpr_).right_;
  pFVar3 = (pFVar1->fadexpr_).left_;
  pFVar4 = (pFVar1->fadexpr_).right_;
  pFVar5 = (pFVar3->fadexpr_).right_;
  pFVar6 = (this->left_->fadexpr_).left_;
  pFVar7 = (this->left_->fadexpr_).right_;
  pFVar8 = (pFVar6->fadexpr_).left_;
  pFVar9 = (pFVar6->fadexpr_).right_;
  return vVar10 * ((pFVar3->fadexpr_).left_.constant_ + pFVar5->val_ + pFVar4->val_ + pFVar2->val_)
         + ((pFVar7->fadexpr_).left_.constant_ + ((pFVar7->fadexpr_).right_)->val_) *
           ((pFVar9->fadexpr_).left_.constant_ + ((pFVar9->fadexpr_).right_)->val_) *
           ((pFVar8->fadexpr_).left_.constant_ + ((pFVar8->fadexpr_).right_)->val_) *
           ((pFVar5->dx_).ptr_to_data[i] + (pFVar4->dx_).ptr_to_data[i] +
           (pFVar2->dx_).ptr_to_data[i]);
}

Assistant:

value_type fastAccessDx(int i) const { return left_.fastAccessDx(i) * right_.val() + right_.fastAccessDx(i) * left_.val();}